

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O0

bool __thiscall BmsChannel::IsBmpChannel(BmsChannel *this)

{
  int iVar1;
  BmsChannel *this_local;
  
  iVar1 = BmsWord::ToInteger(&this->channel_number_);
  if ((((iVar1 == 4) || (iVar1 - 6U < 2)) || (iVar1 == 10)) || (iVar1 == 0x16d)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BmsChannel::IsBmpChannel(void) const
{
	switch (channel_number_.ToInteger()) {
		// 04 06 07 0A A5
	case 4:
	case 6:
	case 7:
	case 10:
	case 365:
		return true;

	default:
		return false;
	}
}